

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RangeTokenMap.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::RangeTokenMap::setRangeToken
          (RangeTokenMap *this,XMLCh *keyword,RangeToken *tok,bool complement)

{
  bool bVar1;
  RangeTokenElemMap *this_00;
  RuntimeException *this_01;
  MemoryManager *memoryManager;
  bool complement_local;
  RangeToken *tok_local;
  XMLCh *keyword_local;
  RangeTokenMap *this_local;
  
  bVar1 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::containsKey
                    (this->fTokenRegistry,keyword);
  if (!bVar1) {
    this_01 = (RuntimeException *)__cxa_allocate_exception(0x30);
    memoryManager =
         RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::getMemoryManager
                   (this->fTokenRegistry);
    RuntimeException::RuntimeException
              (this_01,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RangeTokenMap.cpp"
               ,0xce,Regex_KeywordNotFound,keyword,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
               memoryManager);
    __cxa_throw(this_01,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  this_00 = RefHashTableOf<xercesc_4_0::RangeTokenElemMap,_xercesc_4_0::StringHasher>::get
                      (this->fTokenRegistry,keyword);
  RangeTokenElemMap::setRangeToken(this_00,tok,complement);
  return;
}

Assistant:

void RangeTokenMap::setRangeToken(const XMLCh* const keyword,
                                  RangeToken* const tok,const bool complement) {

    if (fTokenRegistry->containsKey(keyword)) {
        fTokenRegistry->get(keyword)->setRangeToken(tok, complement);
    }
    else {
        ThrowXMLwithMemMgr1(RuntimeException, XMLExcepts::Regex_KeywordNotFound, keyword, fTokenRegistry->getMemoryManager());
    }
}